

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_signed30 e;
  secp256k1_modinv32_trans2x2 local_108;
  secp256k1_modinv32_signed30 *local_f8;
  undefined8 local_f0;
  secp256k1_modinv32_signed30 local_e8;
  int iStack_bc;
  secp256k1_modinv32_signed30 local_b8;
  secp256k1_modinv32_signed30 local_88;
  secp256k1_modinv32_signed30 local_58;
  
  local_88.v[8] = 0;
  local_88.v[4] = 0;
  local_88.v[5] = 0;
  local_88.v[6] = 0;
  local_88.v[7] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[8] = 0;
  local_58.v[4] = 0;
  local_58.v[5] = 0;
  local_58.v[6] = 0;
  local_58.v[7] = 0;
  local_58.v[0] = 1;
  local_58.v[1] = 0;
  local_b8.v[8] = (modinfo->modulus).v[8];
  local_b8.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_b8.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_b8.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_b8.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_e8.v[8] = x->v[8];
  local_e8.v._0_8_ = *(undefined8 *)x->v;
  local_e8.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_e8.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_e8.v._24_8_ = *(undefined8 *)(x->v + 6);
  uVar6 = 9;
  iVar10 = -1;
  local_f8 = x;
  do {
    iVar4 = 0;
    if ((local_e8.v[0] | 0xc0000000U) != 0) {
      for (; ((local_e8.v[0] | 0xc0000000U) >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
      }
    }
    local_108.u = 1 << ((byte)iVar4 & 0x1f);
    local_108.r = 1;
    iVar10 = iVar10 - iVar4;
    if (iVar4 == 0x1e) {
      local_108.q = 0;
      local_108.v = 0;
    }
    else {
      uVar9 = (uint)local_e8.v[0] >> ((byte)iVar4 & 0x1f);
      iVar4 = 0x1e - iVar4;
      local_108.r = 1;
      local_108.v = 0;
      local_108.q = 0;
      uVar2 = local_b8.v[0];
      do {
        iVar7 = local_108.r;
        if (iVar10 < 0) {
          iVar10 = -iVar10;
          uVar1 = -uVar2;
          iVar11 = -local_108.u;
          uVar2 = uVar9;
          uVar9 = uVar1;
          iVar7 = -local_108.v;
          local_108.v = local_108.r;
          local_108.u = local_108.q;
          local_108.q = iVar11;
        }
        iVar11 = iVar10 + 1;
        if (iVar4 <= iVar10 + 1) {
          iVar11 = iVar4;
        }
        uVar1 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar2 >> 1 & 0x7f] * (char)uVar9) <<
                (-(char)iVar11 & 0x1fU)) >> (-(char)iVar11 & 0x1fU);
        uVar9 = uVar1 * uVar2 + uVar9;
        local_108.q = uVar1 * local_108.u + local_108.q;
        local_108.r = uVar1 * local_108.v + iVar7;
        uVar1 = -1 << ((byte)iVar4 & 0x1f) | uVar9;
        iVar7 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        bVar3 = (byte)iVar7;
        uVar9 = uVar9 >> (bVar3 & 0x1f);
        local_108.u = local_108.u << (bVar3 & 0x1f);
        local_108.v = local_108.v << (bVar3 & 0x1f);
        iVar10 = iVar10 - iVar7;
        iVar4 = iVar4 - iVar7;
      } while (iVar4 != 0);
    }
    local_f0 = uVar6;
    secp256k1_modinv32_update_de_30(&local_88,&local_58,&local_108,modinfo);
    uVar6 = local_f0;
    iVar4 = (int)local_f0;
    secp256k1_modinv32_update_fg_30_var(iVar4,&local_b8,&local_e8,&local_108);
    if (local_e8.v[0] == 0) {
      uVar2 = 0;
      if (1 < iVar4) {
        uVar5 = 1;
        do {
          uVar2 = uVar2 | local_e8.v[uVar5];
          uVar5 = uVar5 + 1;
        } while ((uVar6 & 0xffffffff) != uVar5);
        if (uVar2 != 0) goto LAB_00162232;
        uVar2 = 0;
      }
    }
    else {
LAB_00162232:
      iVar7 = (&iStack_bc)[iVar4];
      iVar11 = *(int *)((long)&local_f0 + (long)iVar4 * 4 + 4);
      iVar8 = iVar4 + -2;
      uVar2 = 1;
      if (iVar11 >> 0x1f == iVar11 && (iVar7 >> 0x1f == iVar7 && -1 < iVar8)) {
        uVar6 = (ulong)(iVar4 - 1);
        local_b8.v[iVar8] = local_b8.v[iVar8] | iVar7 << 0x1e;
        local_e8.v[iVar8] = local_e8.v[iVar8] | iVar11 << 0x1e;
      }
    }
    if ((char)uVar2 == '\0') {
      secp256k1_modinv32_normalize_30(&local_88,(&iStack_bc)[(int)uVar6],modinfo);
      local_f8->v[8] = local_88.v[8];
      *(undefined8 *)(local_f8->v + 4) = local_88.v._16_8_;
      *(undefined8 *)(local_f8->v + 6) = local_88.v._24_8_;
      *(undefined8 *)local_f8->v = local_88.v._0_8_;
      *(undefined8 *)(local_f8->v + 2) = local_88.v._8_8_;
      return;
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 d = {{0, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 e = {{1, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 (faster for the variable-time code) */
    int32_t cond, fn, gn;

    /* Do iterations of 30 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_divsteps_30_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of g is 0, there is a chance g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if all other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn ^ (fn >> 31);
        cond |= gn ^ (gn >> 31);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint32_t)fn << 30;
            g.v[len - 2] |= (uint32_t)gn << 30;
            --len;
        }

        VERIFY_CHECK(++i < 25); /* We should never need more than 25*30 = 750 divsteps */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[len - 1], modinfo);
    *x = d;
}